

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O1

size_t __thiscall
ans_reorder_fold_encode<1U>::serialize(ans_reorder_fold_encode<1U> *this,uint8_t **out_u8)

{
  uint8_t *puVar1;
  pointer puVar2;
  size_t sVar3;
  long lVar4;
  
  puVar1 = *out_u8;
  if (this->sigma < 0x100) {
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    lVar4 = 8;
  }
  else {
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar2 = (this->most_frequent).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      *(uint *)(puVar1 + lVar4 * 4 + 4) = puVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    *out_u8 = puVar1 + 0x400;
    lVar4 = 0x408;
  }
  *out_u8 = *out_u8 + 4;
  sVar3 = ans_serialize_interp(&this->nfreqs,this->frame_size,out_u8);
  return sVar3 + lVar4;
}

Assistant:

size_t serialize(uint8_t*& out_u8)
    {
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
        size_t bytes_written = 0;
        if (sigma < no_except_thres) {
            *out_ptr_u32++ = 0;
            bytes_written += sizeof(uint32_t);
        } else {
            *out_ptr_u32++ = 1;
            bytes_written += sizeof(uint32_t);
            for (size_t i = 0; i < no_except_thres; i++) {
                *out_ptr_u32++ = most_frequent[i];
            }
            out_u8 += sizeof(uint32_t) * no_except_thres;
            bytes_written += sizeof(uint32_t) * no_except_thres;
        }
        out_u8 += sizeof(uint32_t);
        bytes_written += sizeof(uint32_t);
        auto interp_written_bytes
            = ans_serialize_interp(nfreqs, frame_size, out_u8);
        return interp_written_bytes + bytes_written;
    }